

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_clause.cpp
# Opt level: O3

bool duckdb::AtClause::Equals
               (optional_ptr<duckdb::AtClause,_true> lhs,optional_ptr<duckdb::AtClause,_true> rhs)

{
  bool bVar1;
  AtClause *in_RSI;
  AtClause *in_RDI;
  optional_ptr<duckdb::AtClause,_true> local_20;
  optional_ptr<duckdb::AtClause,_true> local_18;
  
  if (in_RDI == in_RSI) {
    bVar1 = true;
  }
  else if (in_RSI == (AtClause *)0x0 || in_RDI == (AtClause *)0x0) {
    bVar1 = false;
  }
  else {
    local_20.ptr = in_RSI;
    local_18.ptr = in_RDI;
    optional_ptr<duckdb::AtClause,_true>::CheckValid(&local_18);
    optional_ptr<duckdb::AtClause,_true>::CheckValid(&local_20);
    bVar1 = Equals(local_18.ptr,local_20.ptr);
  }
  return bVar1;
}

Assistant:

bool AtClause::Equals(optional_ptr<AtClause> lhs, optional_ptr<AtClause> rhs) {
	if (lhs.get() == rhs.get()) {
		// same pointer OR both are null
		return true;
	}
	if (!lhs || !rhs) {
		// one is NULL other is not - always not equal
		return false;
	}
	return lhs->Equals(*rhs);
}